

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O2

void testing::internal::ContainerPrinter::
     PrintValue<std::basic_string_view<signed_char,std::char_traits<signed_char>>,void>
               (basic_string_view<signed_char,_std::char_traits<signed_char>_> *container,
               ostream *os)

{
  size_t sVar1;
  char *pcVar2;
  size_t sVar3;
  
  std::operator<<(os,'{');
  sVar1 = container->_M_len;
  pcVar2 = container->_M_str;
  sVar3 = 0;
  do {
    if (sVar1 == sVar3) {
      if (sVar1 != 0) {
LAB_002c7e26:
        std::operator<<(os,' ');
      }
      std::operator<<(os,'}');
      return;
    }
    if ((sVar3 != 0) && (std::operator<<(os,','), sVar3 == 0x20)) {
      std::operator<<(os," ...");
      goto LAB_002c7e26;
    }
    std::operator<<(os,' ');
    UniversalPrinter<signed_char>::Print(pcVar2 + sVar3,os);
    sVar3 = sVar3 + 1;
  } while( true );
}

Assistant:

static void PrintValue(const T& container, std::ostream* os) {
    const size_t kMaxCount = 32;  // The maximum number of elements to print.
    *os << '{';
    size_t count = 0;
    for (auto&& elem : container) {
      if (count > 0) {
        *os << ',';
        if (count == kMaxCount) {  // Enough has been printed.
          *os << " ...";
          break;
        }
      }
      *os << ' ';
      // We cannot call PrintTo(elem, os) here as PrintTo() doesn't
      // handle `elem` being a native array.
      internal::UniversalPrint(elem, os);
      ++count;
    }

    if (count > 0) {
      *os << ' ';
    }
    *os << '}';
  }